

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O3

void Bac_ManWriteBacNtk(Vec_Str_t *vOut,Bac_Ntk_t *pNtk)

{
  int iVar1;
  int *piVar2;
  size_t __size;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  
  pcVar6 = (pNtk->vType).pArray;
  sVar12 = (size_t)(pNtk->vType).nSize;
  iVar7 = vOut->nSize;
  if (vOut->nCap < (int)((long)iVar7 + sVar12)) {
    __size = ((long)iVar7 + sVar12) * 2;
    if (vOut->nCap < (int)__size) {
      if (vOut->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(__size);
      }
      else {
        pcVar5 = (char *)realloc(vOut->pArray,__size);
        iVar7 = vOut->nSize;
      }
      vOut->pArray = pcVar5;
      vOut->nCap = (int)__size;
    }
  }
  memcpy(vOut->pArray + iVar7,pcVar6,sVar12);
  uVar8 = (long)vOut->nSize + sVar12;
  vOut->nSize = (int)uVar8;
  piVar2 = (pNtk->vFanin).pArray;
  lVar11 = (long)(pNtk->vType).nSize;
  lVar10 = lVar11 * 4 + uVar8;
  if (vOut->nCap < (int)lVar10) {
    sVar12 = lVar10 * 2;
    pcVar6 = vOut->pArray;
    if (vOut->nCap < (int)sVar12) {
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar12);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,sVar12);
        uVar8 = (ulong)(uint)vOut->nSize;
      }
      vOut->pArray = pcVar6;
      vOut->nCap = (int)sVar12;
    }
  }
  else {
    pcVar6 = vOut->pArray;
  }
  iVar9 = (int)(lVar11 << 2);
  memcpy(pcVar6 + (int)uVar8,piVar2,(long)iVar9);
  iVar9 = iVar9 + vOut->nSize;
  vOut->nSize = iVar9;
  piVar2 = (pNtk->vInfo).pArray;
  iVar3 = ((pNtk->vInfo).nSize / 3) * 0xc;
  iVar7 = iVar3 + iVar9;
  iVar1 = vOut->nCap;
  if (iVar1 < iVar7) {
    iVar4 = iVar7 * 2;
    pcVar6 = vOut->pArray;
    if (SBORROW4(iVar1,iVar4) != iVar1 + iVar7 * -2 < 0) {
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc((long)iVar4);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,(long)iVar4);
        iVar9 = vOut->nSize;
      }
      vOut->pArray = pcVar6;
      vOut->nCap = iVar4;
    }
  }
  else {
    pcVar6 = vOut->pArray;
  }
  memcpy(pcVar6 + iVar9,piVar2,(long)iVar3);
  vOut->nSize = vOut->nSize + iVar3;
  return;
}

Assistant:

void Bac_ManWriteBacNtk( Vec_Str_t * vOut, Bac_Ntk_t * pNtk )
{
    //char * pName; int iObj, NameId;
    Vec_StrPushBuffer( vOut, (char *)Vec_StrArray(&pNtk->vType),       Bac_NtkObjNum(pNtk) );
    Vec_StrPushBuffer( vOut, (char *)Vec_IntArray(&pNtk->vFanin),  4 * Bac_NtkObjNum(pNtk) );
    Vec_StrPushBuffer( vOut, (char *)Vec_IntArray(&pNtk->vInfo),  12 * Bac_NtkInfoNum(pNtk) );
/*
    // write input/output/box names
    Bac_NtkForEachPiMain( pNtk, iObj, i )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
    Bac_NtkForEachPoMain( pNtk, iObj, i )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
    Bac_NtkForEachBox( pNtk, iObj )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );  
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
*/
}